

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O0

TV __thiscall Nova::Grid<float,_1>::Center(Grid<float,_1> *this,T_INDEX *index)

{
  Vector<int,_1,_true> *in_RDX;
  Vector<float,_1,_true> VVar1;
  Vector<float,_1,_true> local_2c;
  Vector<float,_1,_true> local_28;
  Vector<float,_1,_true> local_24 [3];
  T_INDEX *index_local;
  Grid<float,_1> *this_local;
  
  index_local = index;
  this_local = this;
  Vector<float,_1,_true>::Vector<int>(&local_2c,in_RDX);
  Vector<float,_1,_true>::operator-(&local_28,0.5);
  Vector<float,_1,_true>::operator*(local_24,&local_28);
  VVar1 = Vector<float,_1,_true>::operator+
                    ((Vector<float,_1,_true> *)this,(Vector<float,_1,_true> *)(index + 1));
  return (TV)VVar1._data._M_elems[0];
}

Assistant:

TV Center(const T_INDEX& index) const
    {
        return domain.min_corner+(TV(index)-(T).5)*dX;
    }